

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_generator.cc
# Opt level: O2

void __thiscall re2::StringGenerator::~StringGenerator(StringGenerator *this)

{
  operator_delete(this->acm_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&(this->digits_).super__Vector_base<int,_std::allocator<int>_>);
  std::__cxx11::string::~string((string *)&this->s_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->alphabet_);
  return;
}

Assistant:

StringGenerator::~StringGenerator() {
  delete acm_;
}